

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

size_t __thiscall Memory::Recycler::ScanPinnedObjects<false>(Recycler *this)

{
  void *in_RDX;
  void *extraout_RDX;
  anon_class_16_2_2b7c0a99 fn;
  size_t local_20;
  size_t scanRootBytes;
  
  local_20 = 0;
  if (this->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
    RecyclerObjectGraphDumper::BeginDumpObject(this->objectGraphDumper,L"Pinned");
    in_RDX = extraout_RDX;
  }
  TryMarkNonInterior(this,this->transientPinnedObject,in_RDX);
  if (this->scanPinnedObjectMap == true) {
    this->scanPinnedObjectMap = false;
    fn.scanRootBytes = &local_20;
    fn.this = this;
    SimpleHashTable<void*,Memory::Recycler::PinRecord,Memory::HeapAllocator,DefaultComparer,true,PrimePolicy>
    ::
    MapAndRemoveIf<Memory::Recycler::ScanPinnedObjects<false>()::_lambda(void*,Memory::Recycler::PinRecord_const&)_1_>
              ((SimpleHashTable<void*,Memory::Recycler::PinRecord,Memory::HeapAllocator,DefaultComparer,true,PrimePolicy>
                *)&this->pinnedObjectMap,fn);
    this->hasPendingUnpinnedObject = false;
  }
  if (this->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
    RecyclerObjectGraphDumper::EndDumpObject(this->objectGraphDumper);
  }
  return local_20;
}

Assistant:

size_t Recycler::ScanPinnedObjects()
{
    size_t scanRootBytes = 0;
    BEGIN_DUMP_OBJECT(this, _u("Pinned"));
    {
        this->TryMarkNonInterior(transientPinnedObject, &transientPinnedObject /* parentReference */);
        if (this->scanPinnedObjectMap)
        {
            // We are scanning the pinned object map now, we don't need to rescan unless
            // we reset mark or we add stuff to the map in Recycler::AddRef
            this->scanPinnedObjectMap = false;
            pinnedObjectMap.MapAndRemoveIf([this, &scanRootBytes](void * obj, PinRecord const& refCount)
            {
                if (refCount == 0)
                {
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
                    Assert(refCount.stackBackTraces == nullptr);
#endif
#endif
                    // Only remove if we are not doing this in the background.
                    return !background;
                }
                this->TryMarkNonInterior(obj, static_cast<void*>(const_cast<PinRecord*>(&refCount)) /* parentReference */);
                scanRootBytes += sizeof(void *);
                return false;
            });

            if (!background)
            {
                this->hasPendingUnpinnedObject = false;
            }
        }
    }

    END_DUMP_OBJECT(this);

    if (background)
    {
        // Re-enable resize now that we are done
        pinnedObjectMap.EnableResize();
    }
    return scanRootBytes;
}